

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

GLFWbool waitForVisibilityNotify(_GLFWwindow *window)

{
  int iVar1;
  GLFWbool GVar2;
  undefined1 local_f0 [8];
  XEvent dummy;
  double timeout;
  
  dummy.pad[0x17] = 0x3fb999999999999a;
  do {
    iVar1 = XCheckTypedWindowEvent(_glfw.x11.display,(window->x11).handle,0xf,local_f0);
    if (iVar1 != 0) {
      return iVar1;
    }
    GVar2 = waitForEvent((double *)(dummy.pad + 0x17));
  } while (GVar2 != 0);
  return 0;
}

Assistant:

static GLFWbool waitForVisibilityNotify(_GLFWwindow* window)
{
    XEvent dummy;
    double timeout = 0.1;

    while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                   window->x11.handle,
                                   VisibilityNotify,
                                   &dummy))
    {
        if (!waitForEvent(&timeout))
            return GLFW_FALSE;
    }

    return GLFW_TRUE;
}